

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  CTPNArglist *arglist;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  CTcPrsNode *pCVar7;
  CTPNCall *this;
  CTcPrsSymtab *curtab_1;
  CTPNArg *pCVar8;
  CTcPrsSymtab *pCVar9;
  CTcPrsNode *unaff_R15;
  CTcPrsSymtab *curtab;
  int local_5c;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  CTcPrsNodeBase CStack_38;
  long *plVar6;
  
  arglist = parse_arg_list();
  if (arglist == (CTPNArglist *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  if ((lhs != (CTcPrsNode *)0x0) &&
     (iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"defined",7), iVar2 != 0)
     ) {
    if ((arglist->super_CTPNArglistBase).argc_ == 1) {
      pCVar7 = (((arglist->super_CTPNArglistBase).list_)->super_CTPNArgBase).arg_expr_;
      iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar7);
      if (CONCAT44(extraout_var,iVar2) == 0) goto LAB_002004d4;
      pCVar9 = G_prs->global_symtab_;
      iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar7);
      iVar3 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar7);
      do {
        iVar4 = (*pCVar9->_vptr_CTcPrsSymtab[2])
                          (pCVar9,CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3));
        plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
        if (plVar6 != (long *)0x0) goto LAB_002004ab;
        pCVar9 = pCVar9->parent_;
      } while (pCVar9 != (CTcPrsSymtab *)0x0);
      plVar6 = (long *)0x0;
LAB_002004ab:
      if (plVar6 == (long *)0x0) {
        iVar2 = 1;
      }
      else {
        (**(code **)(*plVar6 + 0x78))(plVar6);
        iVar2 = 2 - (uint)(*(int *)((long)plVar6 + 0x24) == 0);
      }
      unaff_R15 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
      (unaff_R15->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR___cxa_pure_virtual_00316ce0;
      *(byte *)&unaff_R15[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           *(byte *)&unaff_R15[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
      *(int *)&unaff_R15[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = iVar2;
      *(undefined8 *)((long)&unaff_R15[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = local_4c;
      *(ulong *)((long)&unaff_R15[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
           CONCAT44(uStack_40,uStack_44);
      unaff_R15[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)CONCAT44(uStack_3c,uStack_40);
      unaff_R15[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = CStack_38._vptr_CTcPrsNodeBase;
      *(undefined1 *)&unaff_R15[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
      (unaff_R15->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
      bVar1 = false;
    }
    else {
LAB_002004d4:
      CTcTokenizer::log_error(0x2be1);
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_R15;
    }
  }
  if ((lhs == (CTcPrsNode *)0x0) ||
     (iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"__objref",8), iVar2 == 0
     )) goto LAB_00200766;
  iVar2 = (arglist->super_CTPNArglistBase).argc_;
  if (iVar2 < 3) {
    pCVar8 = (arglist->super_CTPNArglistBase).list_;
    if (iVar2 == 2) {
      pCVar7 = (pCVar8->super_CTPNArgBase).arg_expr_;
      pCVar8 = (pCVar8->super_CTPNArgBase).next_arg_;
      iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar7,"warn",4);
      bVar1 = true;
      local_5c = 1;
      if (iVar2 == 0) {
        iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar7,"error",5);
        local_5c = 2;
        if (iVar2 == 0) {
          CTcTokenizer::log_error(0x2be2);
          local_5c = 0;
          bVar1 = false;
          unaff_R15 = lhs;
        }
      }
      if (!bVar1) {
        bVar1 = false;
        goto LAB_00200761;
      }
    }
    else {
      local_5c = 0;
    }
    pCVar7 = (pCVar8->super_CTPNArgBase).arg_expr_;
    iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar7);
    if (CONCAT44(extraout_var_03,iVar2) == 0) {
      CTcTokenizer::log_error(0x2be2);
      bVar1 = true;
    }
    else {
      pCVar9 = G_prs->global_symtab_;
      iVar2 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar7);
      iVar3 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar7);
      do {
        iVar4 = (*pCVar9->_vptr_CTcPrsSymtab[2])
                          (pCVar9,CONCAT44(extraout_var_04,iVar2),CONCAT44(extraout_var_05,iVar3));
        plVar6 = (long *)CONCAT44(extraout_var_06,iVar4);
        if (plVar6 != (long *)0x0) goto LAB_00200671;
        pCVar9 = pCVar9->parent_;
      } while (pCVar9 != (CTcPrsSymtab *)0x0);
      plVar6 = (long *)0x0;
LAB_00200671:
      if ((plVar6 == (long *)0x0) ||
         ((**(code **)(*plVar6 + 0x78))(plVar6), *(int *)((long)plVar6 + 0x24) != 2)) {
        if ((local_5c != 0) && ((G_prs->field_0xec & 4) == 0)) {
          iVar2 = 0x2d00;
          if (plVar6 == (long *)0x0) {
            iVar2 = 0x2b18;
          }
          uVar5 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar7);
          iVar3 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar7);
          if (local_5c == 1) {
            CTcTokenizer::log_warning(iVar2);
          }
          else {
            CTcTokenizer::log_error(iVar2,(ulong)uVar5,CONCAT44(extraout_var_07,iVar3));
          }
        }
        pCVar7 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
        (pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
             (_func_int **)&PTR___cxa_pure_virtual_00316ce0;
        *(byte *)&pCVar7[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             *(byte *)&pCVar7[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
        *(undefined4 *)&pCVar7[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
        *(undefined8 *)((long)&pCVar7[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = local_4c;
        *(ulong *)((long)&pCVar7[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
             CONCAT44(uStack_40,uStack_44);
        pCVar7[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             (_func_int **)CONCAT44(uStack_3c,uStack_40);
        pCVar7[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = CStack_38._vptr_CTcPrsNodeBase;
        *(undefined1 *)&pCVar7[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
        (pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
      }
      bVar1 = false;
      unaff_R15 = pCVar7;
    }
  }
  else {
    bVar1 = false;
    CTcTokenizer::log_error(0x2be2);
    unaff_R15 = lhs;
  }
LAB_00200761:
  if (!bVar1) {
    return unaff_R15;
  }
LAB_00200766:
  this = (CTPNCall *)CTcPrsMem::alloc(G_prsmem,0x18);
  CTPNCall::CTPNCall(this,lhs,arglist);
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)
{
    /* parse the argument list */
    CTPNArglist *arglist = parse_arg_list();
    if (arglist == 0)
        return 0;

    /* check for the special "defined()" syntax */
    if (lhs != 0 && lhs->sym_text_matches("defined", 7))
    {
        /* make sure we have one argument that's a symbol */
        CTcPrsNode *arg;
        if (arglist->get_argc() == 1
            && (arg = arglist->get_arg_list_head()->get_arg_expr())
                ->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());

            /* 
             *   The result is a constant 'true' or 'nil' node, depending on
             *   whether the symbol is defined.  Note that this is a "compile
             *   time constant" expression, not a true constant - flag it as
             *   such so that we don't generate a warning if this value is
             *   used as the conditional expression of an if, while, or for.
             */
            CTcConstVal cval;
            cval.set_bool(sym != 0 && sym->get_type() != TC_SYM_UNKNOWN);
            cval.set_ctc(TRUE);
            return new CTPNConst(&cval);
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR_DEFINED_SYNTAX);
        }
    }

    /* check for the special "__objref" syntax */
    if (lhs != 0 && lhs->sym_text_matches("__objref", 8))
    {
        /* assume we won't generate an error or warning if it's undefined */
        int errhandling = 0;

        /* get the rightmost argument */
        CTPNArg *curarg = arglist->get_arg_list_head();

        /* if we have other than two arguments, it's an error */
        if (arglist->get_argc() > 2)
        {
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
            return lhs;
        }

        /* if we have two arguments, get the warning/error mode */
        if (arglist->get_argc() == 2)
        {
            /* get the argument, and skip to the next to the left */
            CTcPrsNode *arg = curarg->get_arg_expr();
            curarg = curarg->get_next_arg();

            /* it has to be "warn" or "error" */
            if (arg->sym_text_matches("warn", 4))
            {
                errhandling = 1;
            }
            else if (arg->sym_text_matches("error", 5))
            {
                errhandling = 2;
            }
            else
            {
                G_tok->log_error(TCERR___OBJREF_SYNTAX);
                return lhs;
            }
        }

        /* the first argument must be a symbol */
        CTcPrsNode *arg = curarg->get_arg_expr();
        if (arg->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());
            
            /* 
             *   The result is the object reference value if the symbol is
             *   defined as an object, or nil if it's undefined or something
             *   other than an object.
             */
            CTcConstVal cval;
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* it's an object - the result is the object symbol */
                return arg;
            }
            else
            {
                /* log a warning or error, if applicable */
                if (errhandling != 0 && !G_prs->get_syntax_only())
                {
                    /* note whether it's undefined or otherwise defined */
                    int errcode =
                        (sym == 0 ? TCERR_UNDEF_SYM : TCERR_SYM_NOT_OBJ);

                    /* log an error or warning, as desired */
                    if (errhandling == 1)
                        G_tok->log_warning(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                    else
                        G_tok->log_error(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                }
                
                /* not defined or non-object - the result is nil */
                cval.set_bool(FALSE);
                cval.set_ctc(TRUE);
                return new CTPNConst(&cval);
            }
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
        }
    }

    /* build and return the function call node */
    return new CTPNCall(lhs, arglist);
}